

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CloseCurrentPopup(void)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  value_type *pvVar3;
  bool bVar4;
  int local_14;
  int popup_idx;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  local_14 = (GImGui->CurrentPopupStack).Size + -1;
  if ((-1 < local_14) && (local_14 < (GImGui->OpenPopupStack).Size)) {
    pvVar3 = ImVector<ImGuiPopupRef>::operator[](&GImGui->CurrentPopupStack,local_14);
    IVar1 = pvVar3->PopupId;
    pvVar3 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_14);
    if (IVar1 == pvVar3->PopupId) {
      while( true ) {
        bVar4 = false;
        if (0 < local_14) {
          pvVar3 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_14);
          bVar4 = false;
          if (pvVar3->Window != (ImGuiWindow *)0x0) {
            pvVar3 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_14);
            bVar4 = (pvVar3->Window->Flags & 0x10000000U) != 0;
          }
        }
        if (!bVar4) break;
        local_14 = local_14 + -1;
      }
      ClosePopupToLevel(local_14);
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.CurrentPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.CurrentPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;
    while (popup_idx > 0 && g.OpenPopupStack[popup_idx].Window && (g.OpenPopupStack[popup_idx].Window->Flags & ImGuiWindowFlags_ChildMenu))
        popup_idx--;
    ClosePopupToLevel(popup_idx);
}